

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unewdata.cpp
# Opt level: O2

void udata_createDummy(char *dir,char *type,char *name,UErrorCode *pErrorCode)

{
  FILE *__stream;
  UNewDataMemory *pData;
  char *pcVar1;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pData = udata_create(dir,type,name,&dummyDataInfo,(char *)0x0,pErrorCode);
    udata_finish(pData,pErrorCode);
    __stream = _stderr;
    if (U_ZERO_ERROR < *pErrorCode) {
      pcVar1 = u_errorName_63(*pErrorCode);
      fprintf(__stream,"error %s writing dummy data file %s/%s.%s\n",pcVar1,dir,name,type);
      exit(*pErrorCode);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
udata_createDummy(const char *dir, const char *type, const char *name, UErrorCode *pErrorCode) {
    if(U_SUCCESS(*pErrorCode)) {
        udata_finish(udata_create(dir, type, name, &dummyDataInfo, NULL, pErrorCode), pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            fprintf(stderr, "error %s writing dummy data file %s" U_FILE_SEP_STRING "%s.%s\n",
                    u_errorName(*pErrorCode), dir, name, type);
            exit(*pErrorCode);
        }
    }
}